

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_util.cpp
# Opt level: O3

void __thiscall
TaprootUtil_ParseAndVerifyTapScript_Test::~TaprootUtil_ParseAndVerifyTapScript_Test
          (TaprootUtil_ParseAndVerifyTapScript_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(TaprootUtil, ParseAndVerifyTapScript) {
  Transaction tx2("020000000001015b80a1af0e00c700bee9c8e4442bec933fcdc0c686dac2dc336caaaf186c5d190000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50341f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee90122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d5400000000");
  auto stack = tx2.GetTxIn(0).GetScriptWitness().GetWitness();
  SchnorrSignature sig;
  bool parity = false;
  uint8_t tapleaf_flag = 0;
  SchnorrPubkey pk;
  std::vector<ByteData256> nodes;
  Script tapscript;
  std::vector<ByteData> script_stack;
  ByteData annex;
  TaprootUtil::ParseTaprootSignData(stack, &sig, &parity, &tapleaf_flag,
      &pk, &nodes, &tapscript, &script_stack, &annex);
  EXPECT_EQ("", sig.GetHex());
  EXPECT_FALSE(parity);
  uint8_t ver = TaprootScriptTree::kTapScriptLeafVersion;
  EXPECT_EQ(ver, tapleaf_flag);
  EXPECT_EQ("1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb", pk.GetHex());
  EXPECT_EQ(2, nodes.size());
  if (nodes.size() == 2) {
    EXPECT_EQ("4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d",
        nodes[0].GetHex());
    EXPECT_EQ("dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54",
        nodes[1].GetHex());
  }
  EXPECT_EQ("201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac",
      tapscript.GetHex());
  EXPECT_EQ(1, script_stack.size());
  if (script_stack.size() == 1) {
    EXPECT_EQ(
        "f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee901",
        script_stack[0].GetHex());
  }
  EXPECT_TRUE(annex.IsEmpty());

  EXPECT_TRUE(TaprootUtil::VerifyTaprootCommitment(
      parity, tapleaf_flag,
      SchnorrPubkey("3dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d2"),
      pk, nodes, tapscript));
}